

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O2

void small_alloc_create(small_alloc *alloc,slab_cache *cache,uint32_t objsize_min,uint granularity,
                       float alloc_factor,float *actual_alloc_factor)

{
  small_mempool *psVar1;
  uint8_t uVar2;
  slab_cache *cache_00;
  int iVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  size_t sVar7;
  intptr_t iVar8;
  size_t sVar9;
  ulong uVar10;
  uint8_t uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  small_mempool *pool;
  small_mempool *first;
  uint8_t uVar16;
  ulong uVar17;
  
  alloc->cache = cache;
  sVar7 = small_align((ulong)objsize_min,(ulong)granularity);
  iVar8 = slab_order_size(cache,cache->order_max);
  uVar13 = (int)iVar8 - 0x70U >> 4 & 0xfffffff8;
  alloc->objsize_max = uVar13;
  sVar9 = small_align((ulong)uVar13,(ulong)granularity);
  alloc->objsize_max = (uint32_t)sVar9;
  if ((granularity & granularity - 1) != 0) {
    __assert_fail("(granularity & (granularity - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                  ,0x134,
                  "void small_alloc_create(struct small_alloc *, struct slab_cache *, uint32_t, unsigned int, float, float *)"
                 );
  }
  if ((1.0 < alloc_factor) && (alloc_factor <= 2.0)) {
    alloc->factor = alloc_factor;
    small_class_create(&alloc->small_class,granularity,alloc_factor,(uint)sVar7,actual_alloc_factor)
    ;
    psVar1 = alloc->small_mempool_cache;
    alloc->small_mempool_groups_size = 0;
    bVar4 = true;
    uVar13 = 0;
    first = psVar1;
    uVar17 = 0;
    uVar11 = '\0';
    do {
      alloc->small_mempool_cache_size = uVar13;
      uVar6 = alloc->objsize_max;
      if ((uVar6 <= uVar17) || (0x3ff < uVar13)) {
        if ((first->pool).slab_ptr_mask !=
            alloc->small_mempool_cache[(int)(uVar13 - 1)].pool.slab_ptr_mask) {
          __assert_fail("cur_order_pool->pool.slab_ptr_mask == last_pool->pool.slab_ptr_mask",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                        ,0x121,"void small_mempool_create(struct small_alloc *)");
        }
        small_mempool_create_groups(alloc,first,psVar1 + (int)(uVar13 - 1));
        alloc->objsize_max = (uint32_t)uVar17;
        return;
      }
      uVar15 = uVar13 + 1;
      uVar14 = (alloc->small_class).effective_mask & uVar15;
      bVar5 = (byte)(alloc->small_class).effective_bits & 0x1f;
      if (uVar15 >> bVar5 == 0) {
        bVar5 = (byte)(0 >> bVar5);
      }
      else {
        bVar5 = (char)(uVar15 >> bVar5) - 1;
        uVar14 = uVar14 | (alloc->small_class).effective_size;
      }
      uVar15 = ((uVar14 << (bVar5 & 0x1f)) << ((byte)(alloc->small_class).ignore_bits_count & 0x1f))
               + (alloc->small_class).size_shift;
      if (uVar6 <= uVar15) {
        uVar15 = uVar6;
      }
      uVar10 = 0x70;
      if (0x70 < uVar15) {
        uVar10 = (ulong)uVar15;
      }
      cache_00 = alloc->cache;
      uVar12 = (ulong)((double)uVar10 / 0.01);
      uVar12 = (long)((double)uVar10 / 0.01 - 9.223372036854776e+18) & (long)uVar12 >> 0x3f | uVar12
      ;
      uVar10 = (ulong)cache_00->arena->slab_size;
      if (uVar10 <= uVar12) {
        uVar12 = uVar10;
      }
      if (cache_00->order0_size < uVar12) {
        uVar6 = (int)uVar12 - 1;
        iVar3 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        bVar5 = 0x20 - (((byte)iVar3 ^ 0x1f) + cache_00->order0_size_lb);
        if (cache_00->order_max < bVar5) {
          __assert_fail("order <= cache->order_max",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/mempool.h"
                        ,0xfe,"void mempool_create(struct mempool *, struct slab_cache *, uint32_t)"
                       );
        }
      }
      else {
        bVar5 = 0;
      }
      pool = psVar1 + uVar13;
      mempool_create_with_order(&pool->pool,cache_00,uVar15,bVar5);
      *(small_mempool **)((long)&pool->pool + 0x68) = pool;
      pool->objsize_min = uVar17 + 1;
      pool->waste = 0;
      pool->appropriate_pool_mask = 0;
      pool->group = (small_mempool_group *)0x0;
      pool->used_pool = (small_mempool *)0x0;
      uVar2 = (pool->pool).slab_order;
      uVar16 = uVar2;
      if ((!bVar4) && (uVar16 = uVar11, uVar11 != uVar2)) {
        if ((first->pool).slab_ptr_mask != pool[-1].pool.slab_ptr_mask) {
          __assert_fail("cur_order_pool->pool.slab_ptr_mask == (pool - 1)->pool.slab_ptr_mask",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                        ,0x116,"void small_mempool_create(struct small_alloc *)");
        }
        small_mempool_create_groups(alloc,first,pool + -1);
        first = pool;
        uVar16 = uVar2;
      }
      uVar13 = alloc->small_mempool_cache_size + 1;
      bVar4 = false;
      uVar17 = (ulong)uVar15;
      uVar11 = uVar16;
    } while( true );
  }
  __assert_fail("alloc_factor > 1. && alloc_factor <= 2.",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c",
                0x135,
                "void small_alloc_create(struct small_alloc *, struct slab_cache *, uint32_t, unsigned int, float, float *)"
               );
}

Assistant:

void
small_alloc_create(struct small_alloc *alloc, struct slab_cache *cache,
		   uint32_t objsize_min, unsigned granularity,
		   float alloc_factor, float *actual_alloc_factor)
{
	alloc->cache = cache;
	/* Align sizes. */
	objsize_min = small_align(objsize_min, granularity);
	/* Make sure at least 4 largest objects can fit in a slab. */
	alloc->objsize_max =
		mempool_objsize_max(slab_order_size(cache, cache->order_max));
	alloc->objsize_max = small_align(alloc->objsize_max, granularity);

	assert((granularity & (granularity - 1)) == 0);
	assert(alloc_factor > 1. && alloc_factor <= 2.);

	alloc->factor = alloc_factor;
	/*
	 * Second parameter granularity, determines alignment.
	 */
	small_class_create(&alloc->small_class, granularity,
			   alloc->factor, objsize_min, actual_alloc_factor);
	small_mempool_create(alloc);
}